

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

bool __thiscall TPZMHMeshControl::IsSibling(TPZMHMeshControl *this,int64_t son,int64_t father)

{
  TPZGeoMesh *this_00;
  TPZGeoEl **ppTVar1;
  int64_t iVar2;
  long in_RDX;
  int64_t in_RSI;
  TPZChunkVector<TPZGeoEl_*,_10> *in_RDI;
  TPZGeoEl *gel;
  undefined7 in_stack_ffffffffffffffd0;
  bool bVar3;
  TPZGeoEl *local_28;
  
  this_00 = TPZAutoPointer<TPZGeoMesh>::operator->
                      ((TPZAutoPointer<TPZGeoMesh> *)&in_RDI->fNElements);
  TPZGeoMesh::ElementVec(this_00);
  ppTVar1 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](in_RDI,in_RSI);
  local_28 = *ppTVar1;
  while( true ) {
    bVar3 = false;
    if (local_28 != (TPZGeoEl *)0x0) {
      iVar2 = TPZGeoEl::Index(local_28);
      bVar3 = iVar2 != in_RDX;
    }
    if (bVar3 == false) break;
    local_28 = TPZGeoEl::Father((TPZGeoEl *)CONCAT17(bVar3,in_stack_ffffffffffffffd0));
  }
  return local_28 != (TPZGeoEl *)0x0;
}

Assistant:

bool TPZMHMeshControl::IsSibling(int64_t son, int64_t father)
{
    TPZGeoEl *gel = fGMesh->ElementVec()[son];
    while (gel && gel->Index() != father) {
        gel = gel->Father();
    }
    if (gel) {
        return true;
    }
    else
    {
        return false;
    }
}